

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macho.cc
# Opt level: O0

void bloaty::macho::ParseDyldInfo(LoadCommand *cmd,RangeSink *sink)

{
  string_view data;
  string_view data_00;
  string_view data_01;
  string_view data_02;
  string_view data_03;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  long in_RDI;
  string_view sVar1;
  dyld_info_command *info;
  size_t in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  basic_string_view<char,_std::char_traits<char>_> *__str;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffed0;
  basic_string_view<char,_std::char_traits<char>_> *this;
  size_t in_stack_fffffffffffffed8;
  basic_string_view<char,_std::char_traits<char>_> *pbVar2;
  char *in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffef8 [16];
  string_view in_stack_ffffffffffffff08;
  size_t in_stack_ffffffffffffff18;
  size_t sVar3;
  char *in_stack_ffffffffffffff20;
  char *pcVar4;
  
  sVar1._M_str = in_stack_fffffffffffffec0;
  sVar1._M_len = in_stack_fffffffffffffeb8;
  GetStructPointer<dyld_info_command>(sVar1);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  data._M_str = in_stack_fffffffffffffee0;
  data._M_len = in_stack_fffffffffffffed8;
  StrictSubstr(data,(size_t)in_stack_fffffffffffffed0,(size_t)in_stack_fffffffffffffec8);
  name._M_str = in_stack_ffffffffffffff20;
  name._M_len = in_stack_ffffffffffffff18;
  RangeSink::AddFileRange
            (in_stack_fffffffffffffef8._8_8_,in_stack_fffffffffffffef8._0_8_,name,
             in_stack_ffffffffffffff08);
  __str = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffed0,(char *)in_RSI);
  data_00._M_str = in_stack_fffffffffffffee0;
  data_00._M_len = in_stack_fffffffffffffed8;
  StrictSubstr(data_00,(size_t)in_stack_fffffffffffffed0,(size_t)__str);
  name_00._M_str = in_stack_ffffffffffffff20;
  name_00._M_len = in_stack_ffffffffffffff18;
  RangeSink::AddFileRange
            (in_stack_fffffffffffffef8._8_8_,in_stack_fffffffffffffef8._0_8_,name_00,
             in_stack_ffffffffffffff08);
  this = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(in_RSI,(char *)__str);
  data_01._M_str = in_stack_fffffffffffffee0;
  data_01._M_len = in_stack_fffffffffffffed8;
  StrictSubstr(data_01,(size_t)this,(size_t)__str);
  name_01._M_str = in_stack_ffffffffffffff20;
  name_01._M_len = in_stack_ffffffffffffff18;
  RangeSink::AddFileRange
            (in_stack_fffffffffffffef8._8_8_,in_stack_fffffffffffffef8._0_8_,name_01,
             in_stack_ffffffffffffff08);
  pbVar2 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this,(char *)__str);
  sVar3 = *(size_t *)(in_RDI + 0x18);
  pcVar4 = *(char **)(in_RDI + 0x20);
  data_02._M_str = in_stack_fffffffffffffee0;
  data_02._M_len = (size_t)pbVar2;
  StrictSubstr(data_02,(size_t)this,(size_t)__str);
  name_02._M_str = pcVar4;
  name_02._M_len = sVar3;
  RangeSink::AddFileRange
            (in_stack_fffffffffffffef8._8_8_,in_stack_fffffffffffffef8._0_8_,name_02,
             in_stack_ffffffffffffff08);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this,(char *)__str);
  data_03._M_str = (char *)in_RSI;
  data_03._M_len = (size_t)pbVar2;
  sVar1 = StrictSubstr(data_03,(size_t)this,(size_t)__str);
  name_03._M_str = pcVar4;
  name_03._M_len = sVar3;
  RangeSink::AddFileRange
            ((RangeSink *)sVar1._M_str,(char *)sVar1._M_len,name_03,in_stack_ffffffffffffff08);
  return;
}

Assistant:

static void ParseDyldInfo(const LoadCommand& cmd, RangeSink* sink) {
  auto info = GetStructPointer<dyld_info_command>(cmd.command_data);

  sink->AddFileRange(
      "macho_dyld", "Rebase Info",
      StrictSubstr(cmd.file_data, info->rebase_off, info->rebase_size));
  sink->AddFileRange(
      "macho_dyld", "Binding Info",
      StrictSubstr(cmd.file_data, info->bind_off, info->bind_size));
  sink->AddFileRange(
      "macho_dyld", "Weak Binding Info",
      StrictSubstr(cmd.file_data, info->weak_bind_off, info->weak_bind_size));
  sink->AddFileRange(
      "macho_dyld", "Lazy Binding Info",
      StrictSubstr(cmd.file_data, info->lazy_bind_off, info->lazy_bind_size));
  sink->AddFileRange(
      "macho_dyld", "Export Info",
      StrictSubstr(cmd.file_data, info->export_off, info->export_size));
}